

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void type_safe::detail::
     with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>::less_visitor_&,_const_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::union_types<int,_double,_debugger_type>,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
     ::with_impl<debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,
               basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
               *param_2,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                        *param_3)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<debugger_type> local_29;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *local_28;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *args_local;
  less_visitor *func_local;
  tagged_union<int,_double,_debugger_type> *u_local;
  
  local_28 = param_3;
  args_local = param_2;
  func_local = (less_visitor *)param_1;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(param_1);
  union_type<debugger_type>::union_type(&local_29);
  bVar1 = strong_typedef_op::operator==(lhs,&local_29);
  if (bVar1) {
    call<debugger_type>(0,(tagged_union<int,_double,_debugger_type> *)func_local,
                        (less_visitor *)args_local,local_28);
  }
  else {
    with_impl(func_local,args_local,local_28);
  }
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }